

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Sphere __thiscall rw::MorphTarget::calculateBoundingSphere(MorphTarget *this)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  V3d *pVVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Sphere SVar19;
  
  pVVar4 = this->vertices;
  iVar2 = this->parent->numVertices;
  iVar5 = 0;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  fVar7 = 1e+06;
  fVar9 = 1e+06;
  uVar10 = 0;
  uVar11 = 0;
  fVar14 = -1e+06;
  fVar15 = -1e+06;
  fVar13 = -1e+06;
  fVar12 = 1e+06;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar1._0_4_ = pVVar4->x;
    uVar1._4_4_ = pVVar4->y;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1;
    fVar8 = (float)(undefined4)uVar1;
    if ((float)(undefined4)uVar1 <= fVar14) {
      fVar8 = fVar14;
    }
    fVar14 = fVar8;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar1;
    auVar3._4_4_ = fVar15;
    auVar3._0_4_ = fVar14;
    auVar3._8_8_ = 0;
    auVar18 = maxps(auVar17,auVar3);
    fVar15 = auVar18._4_4_;
    auVar18._4_4_ = fVar9;
    auVar18._0_4_ = fVar7;
    auVar18._8_4_ = uVar10;
    auVar18._12_4_ = uVar11;
    auVar16 = minps(auVar16,auVar18);
    fVar8 = (float)pVVar4->z;
    fVar7 = fVar8;
    if (fVar8 <= fVar13) {
      fVar7 = fVar13;
    }
    fVar13 = fVar7;
    if (fVar12 <= fVar8) {
      fVar8 = fVar12;
    }
    pVVar4 = pVVar4 + 1;
    fVar7 = auVar16._0_4_;
    fVar9 = auVar16._4_4_;
    uVar10 = auVar16._8_4_;
    uVar11 = auVar16._12_4_;
    fVar12 = fVar8;
  }
  SVar19.center.x = (fVar7 + fVar14) * 0.5;
  SVar19.center.y = (fVar9 + fVar15) * 0.5;
  SVar19.center.z = (fVar12 + fVar13) * 0.5;
  SVar19.radius =
       (float32)SQRT((fVar13 - SVar19.center.z) * (fVar13 - SVar19.center.z) +
                     (fVar14 - SVar19.center.x) * (fVar14 - SVar19.center.x) +
                     (fVar15 - SVar19.center.y) * (fVar15 - SVar19.center.y));
  return SVar19;
}

Assistant:

Sphere
MorphTarget::calculateBoundingSphere(void) const
{
	Sphere sphere;
	V3d min = {  1000000.0f,  1000000.0f,  1000000.0f };
	V3d max = { -1000000.0f, -1000000.0f, -1000000.0f };
	V3d *v = this->vertices;
	for(int32 j = 0; j < this->parent->numVertices; j++){
		if(v->x > max.x) max.x = v->x;
		if(v->x < min.x) min.x = v->x;
		if(v->y > max.y) max.y = v->y;
		if(v->y < min.y) min.y = v->y;
		if(v->z > max.z) max.z = v->z;
		if(v->z < min.z) min.z = v->z;
		v++;
	}
	sphere.center = scale(add(min, max), 1/2.0f);
	max = sub(max, sphere.center);
	sphere.radius = length(max);
	return sphere;
}